

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O1

void __thiscall
Tree::addDoubleIndirection
          (Tree *this,vector<record,_std::allocator<record>_> *key,Vertex **root,int weightPos)

{
  short sVar1;
  short sVar2;
  Vertex *pVVar3;
  long lVar4;
  
  pVVar3 = *root;
  if (pVVar3 != (Vertex *)0x0) {
    sVar1 = ((key->super__Vector_base<record,_std::allocator<record>_>)._M_impl.
             super__Vector_impl_data._M_start)->year;
    do {
      lVar4 = 0x20;
      sVar2 = ((pVVar3->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
               super__Vector_impl_data._M_start)->year;
      if ((sVar2 <= sVar1) && (lVar4 = 0x18, sVar1 <= sVar2)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Element is already in the array",0x1f);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
        break;
      }
      root = (Vertex **)
             ((long)&(pVVar3->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar4);
      pVVar3 = *(Vertex **)
                ((long)&(pVVar3->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar4);
    } while (pVVar3 != (Vertex *)0x0);
  }
  if (*root == (Vertex *)0x0) {
    pVVar3 = (Vertex *)operator_new(0x30);
    (pVVar3->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pVVar3->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pVVar3->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pVVar3->ptrRight = (Vertex *)0x0;
    *(undefined8 *)((long)&pVVar3->ptrRight + 4) = 0;
    *(undefined8 *)((long)&pVVar3->ptrLeft + 4) = 0;
    *root = pVVar3;
    std::vector<record,_std::allocator<record>_>::operator=
              ((vector<record,_std::allocator<record>_> *)pVVar3,key);
    (*root)->weight =
         (this->m_weightArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[weightPos];
  }
  return;
}

Assistant:

void addDoubleIndirection(vector<record> key, Vertex **root, int weightPos) {
        Vertex **head_ptr = root;
        while (*head_ptr) {
            if (key[0].year < (*head_ptr)->data[0].year) {
                head_ptr = &((*head_ptr)->ptrLeft);
            } else if (key[0].year > (*head_ptr)->data[0].year) {
                head_ptr = &((*head_ptr)->ptrRight);
            } else {
                cout << "Element is already in the array" << endl;
                break;
            }
        }
        if (*head_ptr == nullptr) {
            *head_ptr = new Vertex;
            (*head_ptr)->data = key;
            (*head_ptr)->weight = m_weightArray[weightPos];
        }
    }